

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

PositionalBase * __thiscall
args::
PositionalList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set,_args::ValueReader>
::GetNextPositional(PositionalList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set,_args::ValueReader>
                    *this)

{
  uint uVar1;
  PositionalBase *pPVar2;
  PositionalBase *me;
  bool wasMatched;
  PositionalList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set,_args::ValueReader>
  *this_local;
  
  uVar1 = (*(this->super_PositionalBase).super_NamedBase.super_Base._vptr_Base[2])();
  pPVar2 = PositionalBase::GetNextPositional(&this->super_PositionalBase);
  if ((pPVar2 != (PositionalBase *)0x0) && ((uVar1 & 1) == 0)) {
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->values);
  }
  return pPVar2;
}

Assistant:

virtual PositionalBase *GetNextPositional() override
            {
                const bool wasMatched = Matched();
                auto me = PositionalBase::GetNextPositional();
                if (me && !wasMatched)
                {
                    values.clear();
                }
                return me;
            }